

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dependency.cpp
# Opt level: O0

void __thiscall Dependency::fixFileThatDependsOnMe(Dependency *this,string *file_to_fix)

{
  size_type sVar1;
  string *in_RSI;
  Dependency *in_RDI;
  string *unaff_retaddr;
  int n_1;
  int symamount_1;
  int n;
  int symamount;
  Dependency *in_stack_fffffffffffffed8;
  string local_d0 [32];
  int local_b0;
  int local_ac;
  string local_a8 [32];
  string local_88 [36];
  int local_64;
  int local_60;
  string local_50 [32];
  string local_30 [32];
  Dependency *old_name;
  
  old_name = in_RDI;
  getOriginalPath_abi_cxx11_(in_stack_fffffffffffffed8);
  getInnerPath_abi_cxx11_(in_RDI);
  changeInstallName(unaff_retaddr,&old_name->filename,in_RSI);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_30);
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&in_RDI->symlinks);
  local_60 = (int)sVar1;
  for (local_64 = 0; local_64 < local_60; local_64 = local_64 + 1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](&in_RDI->symlinks,(long)local_64);
    getInnerPath_abi_cxx11_(in_RDI);
    changeInstallName(unaff_retaddr,&old_name->filename,in_RSI);
    std::__cxx11::string::~string(local_88);
  }
  if ((missing_prefixes & 1U) != 0) {
    getInnerPath_abi_cxx11_(in_RDI);
    changeInstallName(unaff_retaddr,&old_name->filename,in_RSI);
    std::__cxx11::string::~string(local_a8);
    sVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&in_RDI->symlinks);
    local_ac = (int)sVar1;
    for (local_b0 = 0; local_b0 < local_ac; local_b0 = local_b0 + 1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&in_RDI->symlinks,(long)local_b0);
      getInnerPath_abi_cxx11_(in_RDI);
      changeInstallName(unaff_retaddr,&old_name->filename,in_RSI);
      std::__cxx11::string::~string(local_d0);
    }
  }
  return;
}

Assistant:

void Dependency::fixFileThatDependsOnMe(const std::string& file_to_fix)
{
    // for main lib file
    changeInstallName(file_to_fix, getOriginalPath(), getInnerPath());
    // for symlinks
    const int symamount = symlinks.size();
    for(int n=0; n<symamount; n++)
    {
        changeInstallName(file_to_fix, symlinks[n], getInnerPath());
    }
    
    // FIXME - hackish
    if(missing_prefixes)
    {
        // for main lib file
        changeInstallName(file_to_fix, filename, getInnerPath());
        // for symlinks
        const int symamount = symlinks.size();
        for(int n=0; n<symamount; n++)
        {
            changeInstallName(file_to_fix, symlinks[n], getInnerPath());
        }
    }
}